

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_arithm<float>(uint length,float value1,float value2,bool allowTrash)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float *pfVar30;
  undefined8 *puVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  undefined1 (*pauVar34) [16];
  uint uVar35;
  ulong uVar36;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var37;
  long lVar38;
  long lVar39;
  long lVar40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var41;
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float *local_68;
  shared_ptr<float> pv1;
  shared_ptr<float> pv2;
  shared_ptr<float> presult;
  
  presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = value1;
  pfVar30 = nosimd::common::malloc<float>(length);
  std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<float,void(*)(float*),void>
            ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)&local_68,pfVar30,
             nosimd::common::free<float>);
  pfVar30 = nosimd::common::malloc<float>(length);
  std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<float,void(*)(float*),void>
            ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)
             &pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pfVar30,
             nosimd::common::free<float>);
  pfVar30 = nosimd::common::malloc<float>(length + 1);
  std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<float,void(*)(float*),void>
            ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)
             &pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pfVar30,
             nosimd::common::free<float>);
  uVar32 = (ulong)length;
  *(undefined4 *)
   ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar32 * 4) = 0x42fe0000;
  pfVar30 = local_68;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    *pfVar30 = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
    ;
    pfVar30[1] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[2] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[3] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[4] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[5] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[6] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[7] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[8] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[9] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[10] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _0_4_;
    pfVar30[0xb] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                   _0_4_;
    pfVar30[0xc] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                   _0_4_;
    pfVar30[0xd] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                   _0_4_;
    pfVar30[0xe] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                   _0_4_;
    pfVar30[0xf] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                   _0_4_;
    pfVar30 = pfVar30 + 0x10;
  }
  if (7 < (int)uVar35) {
    *pfVar30 = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
    ;
    pfVar30[1] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[2] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[3] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[4] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[5] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[6] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[7] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    uVar35 = uVar35 - 8;
    pfVar30 = pfVar30 + 8;
  }
  if (3 < (int)uVar35) {
    *pfVar30 = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
    ;
    pfVar30[1] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[2] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    pfVar30[3] = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _0_4_;
    uVar35 = uVar35 - 4;
    pfVar30 = pfVar30 + 4;
  }
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *pfVar30 = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
    ;
    pfVar30 = pfVar30 + 1;
  }
  _Var41._vptr__Sp_counted_base = CONCAT44(value2,value2);
  _Var41._M_use_count = (_Atomic_word)value2;
  _Var41._M_weak_count = (_Atomic_word)value2;
  _Var37 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    *_Var37._M_pi = _Var41;
    _Var37._M_pi[1] = _Var41;
    _Var37._M_pi[2] = _Var41;
    _Var37._M_pi[3] = _Var41;
    _Var37._M_pi = _Var37._M_pi + 4;
  }
  if (7 < (int)uVar35) {
    *_Var37._M_pi = _Var41;
    _Var37._M_pi[1] = _Var41;
    uVar35 = uVar35 - 8;
    _Var37._M_pi = _Var37._M_pi + 2;
  }
  if (3 < (int)uVar35) {
    *_Var37._M_pi = _Var41;
    uVar35 = uVar35 - 4;
    _Var37._M_pi = _Var37._M_pi + 1;
  }
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)&(_Var37._M_pi)->_vptr__Sp_counted_base = value2;
    _Var37._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(_Var37._M_pi)->_vptr__Sp_counted_base + 4);
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar43 = local_68[uVar36] -
             presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_;
    uVar35 = -(uint)(fVar43 < 0.0);
    if ((1.1920929e-07 <=
         (float)(~uVar35 & (uint)fVar43 |
                (uint)(presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi._0_4_ - local_68[uVar36]) & uVar35)) ||
       (fVar43 = *(float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4),
       fVar44 = fVar43 - value2, uVar35 = -(uint)(fVar44 < 0.0), uVar36 = uVar36 + 1,
       1.1920929e-07 <= (float)(~uVar35 & (uint)fVar44 | (uint)(value2 - fVar43) & uVar35))) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x1a;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar43 = pfVar30[1];
    fVar44 = pfVar30[2];
    fVar45 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar46 = *pfVar2;
    fVar49 = pfVar2[1];
    fVar51 = pfVar2[2];
    fVar4 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x20);
    fVar5 = *pfVar2;
    fVar6 = pfVar2[1];
    fVar7 = pfVar2[2];
    fVar8 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x30);
    fVar9 = *pfVar2;
    fVar10 = pfVar2[1];
    fVar11 = pfVar2[2];
    fVar12 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    fVar13 = pfVar2[1];
    fVar14 = pfVar2[2];
    fVar15 = pfVar2[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar38);
    fVar16 = *pfVar3;
    fVar17 = pfVar3[1];
    fVar18 = pfVar3[2];
    fVar19 = pfVar3[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar38);
    fVar20 = *pfVar3;
    fVar21 = pfVar3[1];
    fVar22 = pfVar3[2];
    fVar23 = pfVar3[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar38);
    fVar24 = *pfVar3;
    fVar25 = pfVar3[1];
    fVar26 = pfVar3[2];
    fVar27 = pfVar3[3];
    pfVar3 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar3 = *pfVar2 + *pfVar30;
    pfVar3[1] = fVar13 + fVar43;
    pfVar3[2] = fVar14 + fVar44;
    pfVar3[3] = fVar15 + fVar45;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar16 + fVar46;
    pfVar30[1] = fVar17 + fVar49;
    pfVar30[2] = fVar18 + fVar51;
    pfVar30[3] = fVar19 + fVar4;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[2]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar20 + fVar5;
    pfVar30[1] = fVar21 + fVar6;
    pfVar30[2] = fVar22 + fVar7;
    pfVar30[3] = fVar23 + fVar8;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[3]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar24 + fVar9;
    pfVar30[1] = fVar25 + fVar10;
    pfVar30[2] = fVar26 + fVar11;
    pfVar30[3] = fVar27 + fVar12;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar43 = pfVar30[1];
    fVar44 = pfVar30[2];
    fVar45 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar46 = *pfVar2;
    fVar49 = pfVar2[1];
    fVar51 = pfVar2[2];
    fVar4 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    fVar5 = pfVar2[1];
    fVar6 = pfVar2[2];
    fVar7 = pfVar2[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar38);
    fVar8 = *pfVar3;
    fVar9 = pfVar3[1];
    fVar10 = pfVar3[2];
    fVar11 = pfVar3[3];
    pfVar3 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar3 = *pfVar2 + *pfVar30;
    pfVar3[1] = fVar5 + fVar43;
    pfVar3[2] = fVar6 + fVar44;
    pfVar3[3] = fVar7 + fVar45;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar8 + fVar46;
    pfVar30[1] = fVar9 + fVar49;
    pfVar30[2] = fVar10 + fVar51;
    pfVar30[3] = fVar11 + fVar4;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    lVar39 = (long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + lVar38;
    pfVar30 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar38);
    lVar38 = lVar38 + (long)local_68;
  }
  else {
    pfVar2 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    pfVar30 = pfVar2 + 4;
    lVar39 = (long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
                    _vptr__Sp_counted_base + lVar38;
    lVar38 = (long)local_68 + lVar38 + 0x10;
    fVar43 = *(float *)(lVar38 + -0xc);
    fVar44 = *(float *)(lVar38 + -8);
    fVar45 = *(float *)(lVar38 + -4);
    fVar46 = pfVar2[1];
    fVar49 = pfVar2[2];
    fVar51 = pfVar2[3];
    *(float *)(lVar39 + -0x10) = *pfVar2 + *(float *)(lVar38 + -0x10);
    *(float *)(lVar39 + -0xc) = fVar46 + fVar43;
    *(float *)(lVar39 + -8) = fVar49 + fVar44;
    *(float *)(lVar39 + -4) = fVar51 + fVar45;
    uVar35 = uVar35 - 4;
  }
  fVar43 = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ +
           value2;
  lVar40 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)(lVar39 + lVar40) = *(float *)(lVar38 + lVar40) + *(float *)((long)pfVar30 + lVar40);
    lVar40 = lVar40 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar44 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    fVar45 = fVar44 - fVar43;
    uVar35 = -(uint)(fVar45 < 0.0);
    uVar36 = uVar36 + 1;
    if (1.1920929e-07 <= (float)(~uVar35 & (uint)fVar45 | (uint)(fVar43 - fVar44) & uVar35)) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x22;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar44 = pfVar30[1];
    fVar45 = pfVar30[2];
    fVar46 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar49 = *pfVar2;
    fVar51 = pfVar2[1];
    fVar4 = pfVar2[2];
    fVar5 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x20);
    fVar6 = *pfVar2;
    fVar7 = pfVar2[1];
    fVar8 = pfVar2[2];
    fVar9 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x30);
    fVar10 = *pfVar2;
    fVar11 = pfVar2[1];
    fVar12 = pfVar2[2];
    fVar13 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    fVar14 = pfVar2[1];
    fVar15 = pfVar2[2];
    fVar16 = pfVar2[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar38);
    fVar17 = *pfVar3;
    fVar18 = pfVar3[1];
    fVar19 = pfVar3[2];
    fVar20 = pfVar3[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar38);
    fVar21 = *pfVar3;
    fVar22 = pfVar3[1];
    fVar23 = pfVar3[2];
    fVar24 = pfVar3[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar38);
    fVar25 = *pfVar3;
    fVar26 = pfVar3[1];
    fVar27 = pfVar3[2];
    fVar28 = pfVar3[3];
    pfVar3 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar3 = *pfVar30 - *pfVar2;
    pfVar3[1] = fVar44 - fVar14;
    pfVar3[2] = fVar45 - fVar15;
    pfVar3[3] = fVar46 - fVar16;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar49 - fVar17;
    pfVar30[1] = fVar51 - fVar18;
    pfVar30[2] = fVar4 - fVar19;
    pfVar30[3] = fVar5 - fVar20;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[2]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar6 - fVar21;
    pfVar30[1] = fVar7 - fVar22;
    pfVar30[2] = fVar8 - fVar23;
    pfVar30[3] = fVar9 - fVar24;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[3]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar10 - fVar25;
    pfVar30[1] = fVar11 - fVar26;
    pfVar30[2] = fVar12 - fVar27;
    pfVar30[3] = fVar13 - fVar28;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar44 = pfVar30[1];
    fVar45 = pfVar30[2];
    fVar46 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar49 = *pfVar2;
    fVar51 = pfVar2[1];
    fVar4 = pfVar2[2];
    fVar5 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    fVar6 = pfVar2[1];
    fVar7 = pfVar2[2];
    fVar8 = pfVar2[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar38);
    fVar9 = *pfVar3;
    fVar10 = pfVar3[1];
    fVar11 = pfVar3[2];
    fVar12 = pfVar3[3];
    pfVar3 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar3 = *pfVar30 - *pfVar2;
    pfVar3[1] = fVar44 - fVar6;
    pfVar3[2] = fVar45 - fVar7;
    pfVar3[3] = fVar46 - fVar8;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar49 - fVar9;
    pfVar30[1] = fVar51 - fVar10;
    pfVar30[2] = fVar4 - fVar11;
    pfVar30[3] = fVar5 - fVar12;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    lVar39 = (long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + lVar38;
    pfVar30 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar38);
    lVar38 = lVar38 + (long)local_68;
  }
  else {
    pfVar2 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    pfVar30 = pfVar2 + 4;
    lVar39 = (long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
                    _vptr__Sp_counted_base + lVar38;
    lVar38 = (long)local_68 + lVar38 + 0x10;
    fVar44 = *(float *)(lVar38 + -0xc);
    fVar45 = *(float *)(lVar38 + -8);
    fVar46 = *(float *)(lVar38 + -4);
    fVar49 = pfVar2[1];
    fVar51 = pfVar2[2];
    fVar4 = pfVar2[3];
    *(float *)(lVar39 + -0x10) = *(float *)(lVar38 + -0x10) - *pfVar2;
    *(float *)(lVar39 + -0xc) = fVar44 - fVar49;
    *(float *)(lVar39 + -8) = fVar45 - fVar51;
    *(float *)(lVar39 + -4) = fVar46 - fVar4;
    uVar35 = uVar35 - 4;
  }
  fVar44 = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ -
           value2;
  lVar40 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)(lVar39 + lVar40) = *(float *)(lVar38 + lVar40) - *(float *)((long)pfVar30 + lVar40);
    lVar40 = lVar40 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar45 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    fVar46 = fVar45 - fVar44;
    uVar35 = -(uint)(fVar46 < 0.0);
    uVar36 = uVar36 + 1;
    if (1.1920929e-07 <= (float)(~uVar35 & (uint)fVar46 | (uint)(fVar44 - fVar45) & uVar35)) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x2a;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar45 = pfVar30[1];
    fVar46 = pfVar30[2];
    fVar49 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar51 = *pfVar2;
    fVar4 = pfVar2[1];
    fVar5 = pfVar2[2];
    fVar6 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x20);
    fVar7 = *pfVar2;
    fVar8 = pfVar2[1];
    fVar9 = pfVar2[2];
    fVar10 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x30);
    fVar11 = *pfVar2;
    fVar12 = pfVar2[1];
    fVar13 = pfVar2[2];
    fVar14 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    fVar15 = pfVar2[1];
    fVar16 = pfVar2[2];
    fVar17 = pfVar2[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar38);
    fVar18 = *pfVar3;
    fVar19 = pfVar3[1];
    fVar20 = pfVar3[2];
    fVar21 = pfVar3[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[2]._vptr__Sp_counted_base + lVar38);
    fVar22 = *pfVar3;
    fVar23 = pfVar3[1];
    fVar24 = pfVar3[2];
    fVar25 = pfVar3[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[3]._vptr__Sp_counted_base + lVar38);
    fVar26 = *pfVar3;
    fVar27 = pfVar3[1];
    fVar28 = pfVar3[2];
    fVar29 = pfVar3[3];
    pfVar3 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar3 = *pfVar2 * *pfVar30;
    pfVar3[1] = fVar15 * fVar45;
    pfVar3[2] = fVar16 * fVar46;
    pfVar3[3] = fVar17 * fVar49;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar18 * fVar51;
    pfVar30[1] = fVar19 * fVar4;
    pfVar30[2] = fVar20 * fVar5;
    pfVar30[3] = fVar21 * fVar6;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[2]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar22 * fVar7;
    pfVar30[1] = fVar23 * fVar8;
    pfVar30[2] = fVar24 * fVar9;
    pfVar30[3] = fVar25 * fVar10;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[3]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar26 * fVar11;
    pfVar30[1] = fVar27 * fVar12;
    pfVar30[2] = fVar28 * fVar13;
    pfVar30[3] = fVar29 * fVar14;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar45 = pfVar30[1];
    fVar46 = pfVar30[2];
    fVar49 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar51 = *pfVar2;
    fVar4 = pfVar2[1];
    fVar5 = pfVar2[2];
    fVar6 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    fVar7 = pfVar2[1];
    fVar8 = pfVar2[2];
    fVar9 = pfVar2[3];
    pfVar3 = (float *)((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi[1]._vptr__Sp_counted_base + lVar38);
    fVar10 = *pfVar3;
    fVar11 = pfVar3[1];
    fVar12 = pfVar3[2];
    fVar13 = pfVar3[3];
    pfVar3 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar3 = *pfVar2 * *pfVar30;
    pfVar3[1] = fVar7 * fVar45;
    pfVar3[2] = fVar8 * fVar46;
    pfVar3[3] = fVar9 * fVar49;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar10 * fVar51;
    pfVar30[1] = fVar11 * fVar4;
    pfVar30[2] = fVar12 * fVar5;
    pfVar30[3] = fVar13 * fVar6;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    lVar39 = (long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + lVar38;
    pfVar30 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar38);
    lVar38 = lVar38 + (long)local_68;
  }
  else {
    pfVar2 = (float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    pfVar30 = pfVar2 + 4;
    lVar39 = (long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
                    _vptr__Sp_counted_base + lVar38;
    lVar38 = (long)local_68 + lVar38 + 0x10;
    fVar45 = *(float *)(lVar38 + -0xc);
    fVar46 = *(float *)(lVar38 + -8);
    fVar49 = *(float *)(lVar38 + -4);
    fVar51 = pfVar2[1];
    fVar4 = pfVar2[2];
    fVar5 = pfVar2[3];
    *(float *)(lVar39 + -0x10) = *pfVar2 * *(float *)(lVar38 + -0x10);
    *(float *)(lVar39 + -0xc) = fVar51 * fVar45;
    *(float *)(lVar39 + -8) = fVar4 * fVar46;
    *(float *)(lVar39 + -4) = fVar5 * fVar49;
    uVar35 = uVar35 - 4;
  }
  fVar45 = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ *
           value2;
  lVar40 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)(lVar39 + lVar40) = *(float *)(lVar38 + lVar40) * *(float *)((long)pfVar30 + lVar40);
    lVar40 = lVar40 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar46 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    fVar49 = fVar46 - fVar45;
    uVar35 = -(uint)(fVar49 < 0.0);
    uVar36 = uVar36 + 1;
    if (1.1920929e-07 <= (float)(~uVar35 & (uint)fVar49 | (uint)(fVar45 - fVar46) & uVar35)) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x32;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    auVar47 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38),
                    *(undefined1 (*) [16])
                     ((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar38));
    auVar50 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x10),
                    *(undefined1 (*) [16])
                     ((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar38));
    auVar52 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x20),
                    *(undefined1 (*) [16])
                     ((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[2]._vptr__Sp_counted_base + lVar38));
    auVar53 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x30),
                    *(undefined1 (*) [16])
                     ((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[3]._vptr__Sp_counted_base + lVar38));
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar38) = auVar47;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar38) = auVar50;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
             _vptr__Sp_counted_base + lVar38) = auVar52;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
             _vptr__Sp_counted_base + lVar38) = auVar53;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    auVar47 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38),
                    *(undefined1 (*) [16])
                     ((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar38));
    auVar50 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x10),
                    *(undefined1 (*) [16])
                     ((long)&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar38));
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar38) = auVar47;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar38) = auVar50;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    lVar39 = (long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + lVar38;
    pauVar34 = (undefined1 (*) [16])
               ((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                       ->_vptr__Sp_counted_base + lVar38);
    lVar38 = lVar38 + (long)local_68;
  }
  else {
    pauVar33 = (undefined1 (*) [16])
               ((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                       ->_vptr__Sp_counted_base + lVar38);
    pauVar34 = pauVar33 + 1;
    lVar39 = (long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
                    _vptr__Sp_counted_base + lVar38;
    lVar38 = (long)local_68 + lVar38 + 0x10;
    auVar47 = divps(*(undefined1 (*) [16])(lVar38 + -0x10),*pauVar33);
    *(undefined1 (*) [16])(lVar39 + -0x10) = auVar47;
    uVar35 = uVar35 - 4;
  }
  fVar46 = presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ /
           value2;
  lVar40 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)(lVar39 + lVar40) = *(float *)(lVar38 + lVar40) / *(float *)(*pauVar34 + lVar40);
    lVar40 = lVar40 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar49 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    fVar51 = fVar49 - fVar46;
    uVar35 = -(uint)(fVar51 < 0.0);
    uVar36 = uVar36 + 1;
    if (1.1920929e-07 <= (float)(~uVar35 & (uint)fVar51 | (uint)(fVar46 - fVar49) & uVar35)) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x3a;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar49 = pfVar30[1];
    fVar51 = pfVar30[2];
    fVar4 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar5 = *pfVar2;
    fVar6 = pfVar2[1];
    fVar7 = pfVar2[2];
    fVar8 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x20);
    fVar9 = *pfVar2;
    fVar10 = pfVar2[1];
    fVar11 = pfVar2[2];
    fVar12 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x30);
    fVar13 = *pfVar2;
    fVar14 = pfVar2[1];
    fVar15 = pfVar2[2];
    fVar16 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar2 = *pfVar30 + value2;
    pfVar2[1] = fVar49 + value2;
    pfVar2[2] = fVar51 + value2;
    pfVar2[3] = fVar4 + value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar5 + value2;
    pfVar30[1] = fVar6 + value2;
    pfVar30[2] = fVar7 + value2;
    pfVar30[3] = fVar8 + value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[2]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar9 + value2;
    pfVar30[1] = fVar10 + value2;
    pfVar30[2] = fVar11 + value2;
    pfVar30[3] = fVar12 + value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[3]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar13 + value2;
    pfVar30[1] = fVar14 + value2;
    pfVar30[2] = fVar15 + value2;
    pfVar30[3] = fVar16 + value2;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar49 = pfVar30[1];
    fVar51 = pfVar30[2];
    fVar4 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar5 = *pfVar2;
    fVar6 = pfVar2[1];
    fVar7 = pfVar2[2];
    fVar8 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar2 = *pfVar30 + value2;
    pfVar2[1] = fVar49 + value2;
    pfVar2[2] = fVar51 + value2;
    pfVar2[3] = fVar4 + value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar5 + value2;
    pfVar30[1] = fVar6 + value2;
    pfVar30[2] = fVar7 + value2;
    pfVar30[3] = fVar8 + value2;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    pfVar30 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar38);
    lVar38 = lVar38 + (long)local_68;
  }
  else {
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    pfVar30 = pfVar2 + 4;
    lVar38 = (long)local_68 + lVar38 + 0x10;
    fVar49 = *(float *)(lVar38 + -0xc);
    fVar51 = *(float *)(lVar38 + -8);
    fVar4 = *(float *)(lVar38 + -4);
    *pfVar2 = *(float *)(lVar38 + -0x10) + value2;
    pfVar2[1] = fVar49 + value2;
    pfVar2[2] = fVar51 + value2;
    pfVar2[3] = fVar4 + value2;
    uVar35 = uVar35 - 4;
  }
  lVar39 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)((long)pfVar30 + lVar39) = *(float *)(lVar38 + lVar39) + value2;
    lVar39 = lVar39 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar49 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    fVar51 = fVar49 - fVar43;
    uVar35 = -(uint)(fVar51 < 0.0);
    uVar36 = uVar36 + 1;
    if (1.1920929e-07 <= (float)(~uVar35 & (uint)fVar51 | (uint)(fVar43 - fVar49) & uVar35)) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x43;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar43 = pfVar30[1];
    fVar49 = pfVar30[2];
    fVar51 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar4 = *pfVar2;
    fVar5 = pfVar2[1];
    fVar6 = pfVar2[2];
    fVar7 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x20);
    fVar8 = *pfVar2;
    fVar9 = pfVar2[1];
    fVar10 = pfVar2[2];
    fVar11 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x30);
    fVar12 = *pfVar2;
    fVar13 = pfVar2[1];
    fVar14 = pfVar2[2];
    fVar15 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar2 = *pfVar30 - value2;
    pfVar2[1] = fVar43 - value2;
    pfVar2[2] = fVar49 - value2;
    pfVar2[3] = fVar51 - value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar4 - value2;
    pfVar30[1] = fVar5 - value2;
    pfVar30[2] = fVar6 - value2;
    pfVar30[3] = fVar7 - value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[2]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar8 - value2;
    pfVar30[1] = fVar9 - value2;
    pfVar30[2] = fVar10 - value2;
    pfVar30[3] = fVar11 - value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[3]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar12 - value2;
    pfVar30[1] = fVar13 - value2;
    pfVar30[2] = fVar14 - value2;
    pfVar30[3] = fVar15 - value2;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar43 = pfVar30[1];
    fVar49 = pfVar30[2];
    fVar51 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar4 = *pfVar2;
    fVar5 = pfVar2[1];
    fVar6 = pfVar2[2];
    fVar7 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar2 = *pfVar30 - value2;
    pfVar2[1] = fVar43 - value2;
    pfVar2[2] = fVar49 - value2;
    pfVar2[3] = fVar51 - value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar4 - value2;
    pfVar30[1] = fVar5 - value2;
    pfVar30[2] = fVar6 - value2;
    pfVar30[3] = fVar7 - value2;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    pfVar30 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar38);
    lVar38 = lVar38 + (long)local_68;
  }
  else {
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    pfVar30 = pfVar2 + 4;
    lVar38 = (long)local_68 + lVar38 + 0x10;
    fVar43 = *(float *)(lVar38 + -0xc);
    fVar49 = *(float *)(lVar38 + -8);
    fVar51 = *(float *)(lVar38 + -4);
    *pfVar2 = *(float *)(lVar38 + -0x10) - value2;
    pfVar2[1] = fVar43 - value2;
    pfVar2[2] = fVar49 - value2;
    pfVar2[3] = fVar51 - value2;
    uVar35 = uVar35 - 4;
  }
  lVar39 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)((long)pfVar30 + lVar39) = *(float *)(lVar38 + lVar39) - value2;
    lVar39 = lVar39 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar43 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    uVar36 = uVar36 + 1;
    if ((fVar43 != fVar44) || (NAN(fVar43) || NAN(fVar44))) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x4b;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar43 = pfVar30[1];
    fVar44 = pfVar30[2];
    fVar49 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar51 = *pfVar2;
    fVar4 = pfVar2[1];
    fVar5 = pfVar2[2];
    fVar6 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x20);
    fVar7 = *pfVar2;
    fVar8 = pfVar2[1];
    fVar9 = pfVar2[2];
    fVar10 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x30);
    fVar11 = *pfVar2;
    fVar12 = pfVar2[1];
    fVar13 = pfVar2[2];
    fVar14 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar2 = value2 - *pfVar30;
    pfVar2[1] = value2 - fVar43;
    pfVar2[2] = value2 - fVar44;
    pfVar2[3] = value2 - fVar49;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = value2 - fVar51;
    pfVar30[1] = value2 - fVar4;
    pfVar30[2] = value2 - fVar5;
    pfVar30[3] = value2 - fVar6;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[2]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = value2 - fVar7;
    pfVar30[1] = value2 - fVar8;
    pfVar30[2] = value2 - fVar9;
    pfVar30[3] = value2 - fVar10;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[3]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = value2 - fVar11;
    pfVar30[1] = value2 - fVar12;
    pfVar30[2] = value2 - fVar13;
    pfVar30[3] = value2 - fVar14;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar43 = pfVar30[1];
    fVar44 = pfVar30[2];
    fVar49 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar51 = *pfVar2;
    fVar4 = pfVar2[1];
    fVar5 = pfVar2[2];
    fVar6 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar2 = value2 - *pfVar30;
    pfVar2[1] = value2 - fVar43;
    pfVar2[2] = value2 - fVar44;
    pfVar2[3] = value2 - fVar49;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = value2 - fVar51;
    pfVar30[1] = value2 - fVar4;
    pfVar30[2] = value2 - fVar5;
    pfVar30[3] = value2 - fVar6;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    pfVar30 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar38);
    lVar38 = lVar38 + (long)local_68;
  }
  else {
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    pfVar30 = pfVar2 + 4;
    lVar38 = (long)local_68 + lVar38 + 0x10;
    fVar43 = *(float *)(lVar38 + -0xc);
    fVar44 = *(float *)(lVar38 + -8);
    fVar49 = *(float *)(lVar38 + -4);
    *pfVar2 = value2 - *(float *)(lVar38 + -0x10);
    pfVar2[1] = value2 - fVar43;
    pfVar2[2] = value2 - fVar44;
    pfVar2[3] = value2 - fVar49;
    uVar35 = uVar35 - 4;
  }
  lVar39 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)((long)pfVar30 + lVar39) = value2 - *(float *)(lVar38 + lVar39);
    lVar39 = lVar39 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar43 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    fVar44 = fVar43 - (value2 - presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._0_4_);
    uVar35 = -(uint)(fVar44 < 0.0);
    uVar36 = uVar36 + 1;
    if (1.1920929e-07 <=
        (float)(~uVar35 & (uint)fVar44 |
               (uint)((value2 - presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._0_4_) - fVar43) & uVar35)) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x53;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar43 = pfVar30[1];
    fVar44 = pfVar30[2];
    fVar49 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar51 = *pfVar2;
    fVar4 = pfVar2[1];
    fVar5 = pfVar2[2];
    fVar6 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x20);
    fVar7 = *pfVar2;
    fVar8 = pfVar2[1];
    fVar9 = pfVar2[2];
    fVar10 = pfVar2[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x30);
    fVar11 = *pfVar2;
    fVar12 = pfVar2[1];
    fVar13 = pfVar2[2];
    fVar14 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar2 = *pfVar30 * value2;
    pfVar2[1] = fVar43 * value2;
    pfVar2[2] = fVar44 * value2;
    pfVar2[3] = fVar49 * value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar51 * value2;
    pfVar30[1] = fVar4 * value2;
    pfVar30[2] = fVar5 * value2;
    pfVar30[3] = fVar6 * value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[2]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar7 * value2;
    pfVar30[1] = fVar8 * value2;
    pfVar30[2] = fVar9 * value2;
    pfVar30[3] = fVar10 * value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[3]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar11 * value2;
    pfVar30[1] = fVar12 * value2;
    pfVar30[2] = fVar13 * value2;
    pfVar30[3] = fVar14 * value2;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    pfVar30 = (float *)((long)local_68 + lVar38);
    fVar43 = pfVar30[1];
    fVar44 = pfVar30[2];
    fVar49 = pfVar30[3];
    pfVar2 = (float *)((long)local_68 + lVar38 + 0x10);
    fVar51 = *pfVar2;
    fVar4 = pfVar2[1];
    fVar5 = pfVar2[2];
    fVar6 = pfVar2[3];
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    *pfVar2 = *pfVar30 * value2;
    pfVar2[1] = fVar43 * value2;
    pfVar2[2] = fVar44 * value2;
    pfVar2[3] = fVar49 * value2;
    pfVar30 = (float *)((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi[1]._vptr__Sp_counted_base + lVar38);
    *pfVar30 = fVar51 * value2;
    pfVar30[1] = fVar4 * value2;
    pfVar30[2] = fVar5 * value2;
    pfVar30[3] = fVar6 * value2;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    pfVar30 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar38);
    lVar38 = lVar38 + (long)local_68;
  }
  else {
    pfVar2 = (float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + lVar38);
    pfVar30 = pfVar2 + 4;
    lVar38 = (long)local_68 + lVar38 + 0x10;
    fVar43 = *(float *)(lVar38 + -0xc);
    fVar44 = *(float *)(lVar38 + -8);
    fVar49 = *(float *)(lVar38 + -4);
    *pfVar2 = *(float *)(lVar38 + -0x10) * value2;
    pfVar2[1] = fVar43 * value2;
    pfVar2[2] = fVar44 * value2;
    pfVar2[3] = fVar49 * value2;
    uVar35 = uVar35 - 4;
  }
  lVar39 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)((long)pfVar30 + lVar39) = *(float *)(lVar38 + lVar39) * value2;
    lVar39 = lVar39 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar43 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    uVar36 = uVar36 + 1;
    if ((fVar43 != fVar45) || (NAN(fVar43) || NAN(fVar45))) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x5b;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    auVar47 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38),(undefined1  [16])_Var41);
    auVar50 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x10),(undefined1  [16])_Var41)
    ;
    auVar52 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x20),(undefined1  [16])_Var41)
    ;
    auVar53 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x30),(undefined1  [16])_Var41)
    ;
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar38) = auVar47;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar38) = auVar50;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
             _vptr__Sp_counted_base + lVar38) = auVar52;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
             _vptr__Sp_counted_base + lVar38) = auVar53;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    auVar47 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38),(undefined1  [16])_Var41);
    auVar50 = divps(*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x10),(undefined1  [16])_Var41)
    ;
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar38) = auVar47;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar38) = auVar50;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    pauVar34 = (undefined1 (*) [16])
               ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                       ->_vptr__Sp_counted_base + lVar38);
    lVar38 = lVar38 + (long)local_68;
  }
  else {
    pauVar33 = (undefined1 (*) [16])
               ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                       ->_vptr__Sp_counted_base + lVar38);
    pauVar34 = pauVar33 + 1;
    lVar38 = (long)local_68 + lVar38 + 0x10;
    auVar47 = divps(*(undefined1 (*) [16])(lVar38 + -0x10),(undefined1  [16])_Var41);
    *pauVar33 = auVar47;
    uVar35 = uVar35 - 4;
  }
  lVar39 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)(*pauVar34 + lVar39) = *(float *)(lVar38 + lVar39) / value2;
    lVar39 = lVar39 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar43 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    fVar44 = fVar43 - fVar46;
    uVar35 = -(uint)(fVar44 < 0.0);
    uVar36 = uVar36 + 1;
    if (1.1920929e-07 <= (float)(~uVar35 & (uint)fVar44 | (uint)(fVar46 - fVar43) & uVar35)) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 99;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  lVar38 = 0;
  for (uVar35 = length; 0xf < (int)uVar35; uVar35 = uVar35 - 0x10) {
    auVar53._8_4_ = value2;
    auVar53._0_8_ = _Var41._vptr__Sp_counted_base;
    auVar53._12_4_ = value2;
    auVar53 = divps(auVar53,*(undefined1 (*) [16])((long)local_68 + lVar38));
    auVar47._8_4_ = value2;
    auVar47._0_8_ = _Var41._vptr__Sp_counted_base;
    auVar47._12_4_ = value2;
    auVar47 = divps(auVar47,*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x10));
    auVar50._8_4_ = value2;
    auVar50._0_8_ = _Var41._vptr__Sp_counted_base;
    auVar50._12_4_ = value2;
    auVar50 = divps(auVar50,*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x20));
    auVar52._8_4_ = value2;
    auVar52._0_8_ = _Var41._vptr__Sp_counted_base;
    auVar52._12_4_ = value2;
    auVar52 = divps(auVar52,*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x30));
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar38) = auVar53;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar38) = auVar47;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
             _vptr__Sp_counted_base + lVar38) = auVar50;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
             _vptr__Sp_counted_base + lVar38) = auVar52;
    lVar38 = lVar38 + 0x40;
  }
  for (; 7 < (int)uVar35; uVar35 = uVar35 - 8) {
    auVar48._8_4_ = value2;
    auVar48._0_8_ = _Var41._vptr__Sp_counted_base;
    auVar48._12_4_ = value2;
    auVar50 = divps(auVar48,*(undefined1 (*) [16])((long)local_68 + lVar38));
    auVar42._8_4_ = value2;
    auVar42._0_8_ = _Var41._vptr__Sp_counted_base;
    auVar42._12_4_ = value2;
    auVar47 = divps(auVar42,*(undefined1 (*) [16])((long)local_68 + lVar38 + 0x10));
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar38) = auVar50;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar38) = auVar47;
    lVar38 = lVar38 + 0x20;
  }
  if ((int)uVar35 < 4) {
    pauVar34 = (undefined1 (*) [16])
               ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                       ->_vptr__Sp_counted_base + lVar38);
    pauVar33 = (undefined1 (*) [16])((long)local_68 + lVar38);
  }
  else {
    pauVar33 = (undefined1 (*) [16])((long)local_68 + lVar38) + 1;
    auVar47 = divps((undefined1  [16])_Var41,*(undefined1 (*) [16])((long)local_68 + lVar38));
    pauVar1 = (undefined1 (*) [16])
              ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + lVar38);
    pauVar34 = pauVar1 + 1;
    *pauVar1 = auVar47;
    uVar35 = uVar35 - 4;
  }
  lVar38 = 0;
  for (; 0 < (int)uVar35; uVar35 = uVar35 - 1) {
    *(float *)(*pauVar34 + lVar38) = value2 / *(float *)(*pauVar33 + lVar38);
    lVar38 = lVar38 + 4;
  }
  uVar36 = 0;
  while (uVar32 != uVar36) {
    fVar43 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar36 * 4);
    fVar44 = fVar43 - value2 / presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_4_;
    uVar35 = -(uint)(fVar44 < 0.0);
    uVar36 = uVar36 + 1;
    if (1.1920929e-07 <=
        (float)(~uVar35 & (uint)fVar44 |
               (uint)(value2 / presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_4_ - fVar43) & uVar35)) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar31 + 1) = 0x6b;
      *(uint *)((long)puVar31 + 0xc) = length;
      __cxa_throw(puVar31,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) &&
     ((fVar43 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar32 * 4),
      fVar43 != 127.0 || (NAN(fVar43))))) {
    puVar31 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar31 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
    *(undefined4 *)(puVar31 + 1) = 0x70;
    *(uint *)((long)puVar31 + 0xc) = length;
    __cxa_throw(puVar31,&Exception::typeinfo,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}